

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall embree::ImageT<embree::Col3<float>_>::~ImageT(ImageT<embree::Col3<float>_> *this)

{
  pointer pcVar1;
  
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__ImageT_002c8228;
  if (this->data != (Col3<float> *)0x0) {
    operator_delete__(this->data);
  }
  this->data = (Col3<float> *)0x0;
  (this->super_Image).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Image_002c6c00;
  pcVar1 = (this->super_Image).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_Image).name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~ImageT() {
      delete[] data; data = nullptr;
    }